

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_mtc0_store32(TCGContext_conflict6 *tcg_ctx,TCGv_i64 arg,target_ulong off)

{
  TCGv_i32 ret;
  uintptr_t o;
  
  ret = tcg_temp_new_i32(tcg_ctx);
  tcg_gen_extrl_i64_i32_mips64el(tcg_ctx,ret,arg);
  tcg_gen_st_i32(tcg_ctx,ret,tcg_ctx->cpu_env,off);
  tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
  return;
}

Assistant:

static inline void gen_mtc0_store32(TCGContext *tcg_ctx, TCGv arg, target_ulong off)
{
    TCGv_i32 t0 = tcg_temp_new_i32(tcg_ctx);

    tcg_gen_trunc_tl_i32(tcg_ctx, t0, arg);
    tcg_gen_st_i32(tcg_ctx, t0, tcg_ctx->cpu_env, off);
    tcg_temp_free_i32(tcg_ctx, t0);
}